

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hpp
# Opt level: O1

void __thiscall Arguments::RefAction<bool>::~RefAction(RefAction<bool> *this)

{
  operator_delete(this);
  return;
}

Assistant:

virtual String match(const Descriptor & desc, const String * values, const int valuesCount)
        {
            if (valuesCount != desc.requiredValues || !valuesCount)
            {
                if (desc.requiredValues <= 1 && !valuesCount)
                {   // Presence of the flag is enough to enable the argument
                    ref = true;
                    return "";
                }
            }
            if (desc.requiredValues > 1 && (valuesCount != 1 || !values)) return TRANS("Invalid number of arguments for option: ") + TRANS(desc.longTrigger);
            ref = values[0] == "y" || values[0] == "Y" || values[0] == "yes" || values[0] == "true";
            return "";
        }